

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O0

UINT8 device_start_x1_010(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  x1_010_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x20b0);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT32 *)((long)devData.chipInf + 0x209c) = cfg->clock;
    *(uint *)&((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf =
         *(uint *)((long)devData.chipInf + 0x209c) >> 9;
    if ((cfg->srMode == '\x01') ||
       ((cfg->srMode == '\x02' &&
        (*(uint *)&((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf < cfg->smplRate)))) {
      *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf = cfg->smplRate;
    }
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = 0;
    ((DEV_DATA *)((long)devData.chipInf + 0x10))->chipInf = (void *)0x0;
    x1_010_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 0x18),
                &devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_x1_010(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	x1_010_state *info;

	info = (x1_010_state *)calloc(1, sizeof(x1_010_state));
	if (info == NULL)
		return 0xFF;

	info->base_clock    = cfg->clock;
	info->rate          = info->base_clock / 512;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->rate, cfg->smplRate);

	info->ROMSize       = 0x00;
	info->rom           = NULL;

	/* Print some more debug info */
	//LOG_SOUND(("masterclock = %d rate = %d\n", info->base_clock, info->rate ));

	x1_010_set_mute_mask(info, 0x0000);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);

	return 0x00;
}